

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O2

void __thiscall DLoadSaveMenu::UnloadSaveData(DLoadSaveMenu *this)

{
  if (this->SavePic != (FTexture *)0x0) {
    (*this->SavePic->_vptr_FTexture[1])();
  }
  if (this->SaveComment != (FBrokenLines *)0x0) {
    V_FreeBrokenLines(this->SaveComment);
  }
  this->SavePic = (FTexture *)0x0;
  this->SaveComment = (FBrokenLines *)0x0;
  return;
}

Assistant:

void DLoadSaveMenu::UnloadSaveData ()
{
	if (SavePic != NULL)
	{
		delete SavePic;
	}
	if (SaveComment != NULL)
	{
		V_FreeBrokenLines (SaveComment);
	}

	SavePic = NULL;
	SaveComment = NULL;
}